

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O1

void skiwi::inline_ieee754_pi(asmcode *code,compiler_options *param_2)

{
  uint64_t header;
  operation local_48;
  operand local_44 [3];
  unsigned_long local_38;
  
  local_38 = 0x100000000000001;
  local_48 = MOV;
  local_44[1] = 10;
  local_44[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,local_44 + 1,local_44);
  local_48 = OR;
  local_44[1] = 10;
  local_44[0] = NUMBER;
  local_44[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_48 = MOV;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_48,local_44 + 1,local_44,&local_38);
  local_48 = MOV;
  local_44[1] = 0x20;
  local_44[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,local_44 + 1,local_44);
  local_48 = FLDPI;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_48);
  local_48 = FSTP;
  local_44[1] = 0x20;
  local_44[0] = DH;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,&local_48,local_44 + 1,(int *)local_44);
  local_48 = ADD;
  local_44[1] = 0x10;
  local_44[0] = NUMBER;
  local_44[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_48,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_48 = MOV;
  local_44[1] = 9;
  local_44[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_48,local_44 + 1,local_44);
  return;
}

Assistant:

void inline_ieee754_pi(ASM::asmcode& code, const compiler_options&)
  {
  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FLDPI);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }